

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseExtend
          (Parser *this,RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *extend_location,FileDescriptorProto *containing_file)

{
  bool bVar1;
  int path1;
  Token *pTVar2;
  undefined1 local_138 [8];
  LocationRecorder extendee_location;
  FieldDescriptorProto *field;
  LocationRecorder location;
  string local_108;
  byte local_e1;
  undefined1 local_e0 [7];
  bool is_first;
  Token extendee_end;
  undefined1 local_98 [8];
  string extendee;
  Token extendee_start;
  LocationRecorder *extend_location_local;
  int location_field_number_for_nested_type_local;
  LocationRecorder *parent_location_local;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages_local;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions_local;
  Parser *this_local;
  
  bVar1 = Consume(this,"extend");
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(this->input_);
    io::Tokenizer::Token::Token((Token *)((long)&extendee.field_2 + 8),pTVar2);
    std::__cxx11::string::string((string *)local_98);
    bVar1 = ParseUserDefinedType(this,(string *)local_98);
    if (bVar1) {
      pTVar2 = io::Tokenizer::previous(this->input_);
      io::Tokenizer::Token::Token((Token *)local_e0,pTVar2);
      bVar1 = ConsumeEndOfDeclaration(this,"{",extend_location);
      if (bVar1) {
        local_e1 = 1;
        do {
          bVar1 = AtEnd(this);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_108,
                       "Reached end of input in extend definition (missing \'}\').",
                       (allocator *)((long)&location.location_ + 7));
            AddError(this,&local_108);
            std::__cxx11::string::~string((string *)&local_108);
            std::allocator<char>::~allocator((allocator<char> *)((long)&location.location_ + 7));
            this_local._7_1_ = false;
            goto LAB_004bce1c;
          }
          path1 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::size(extensions);
          LocationRecorder::LocationRecorder((LocationRecorder *)&field,extend_location,path1);
          extendee_location.location_ =
               (Location *)RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(extensions)
          ;
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_138,(LocationRecorder *)&field,2);
          LocationRecorder::StartAt
                    ((LocationRecorder *)local_138,(Token *)((long)&extendee.field_2 + 8));
          LocationRecorder::EndAt((LocationRecorder *)local_138,(Token *)local_e0);
          if ((local_e1 & 1) != 0) {
            LocationRecorder::RecordLegacyLocation
                      ((LocationRecorder *)local_138,&(extendee_location.location_)->super_Message,
                       EXTENDEE);
            local_e1 = 0;
          }
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_138);
          FieldDescriptorProto::set_extendee
                    ((FieldDescriptorProto *)extendee_location.location_,(string *)local_98);
          bVar1 = ParseMessageField(this,(FieldDescriptorProto *)extendee_location.location_,
                                    messages,parent_location,location_field_number_for_nested_type,
                                    (LocationRecorder *)&field,containing_file);
          if (!bVar1) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder((LocationRecorder *)&field);
          bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
LAB_004bce1c:
      extendee_end.end_column = 1;
      io::Tokenizer::Token::~Token((Token *)local_e0);
    }
    else {
      this_local._7_1_ = false;
      extendee_end.end_column = 1;
    }
    std::__cxx11::string::~string((string *)local_98);
    io::Tokenizer::Token::~Token((Token *)((long)&extendee.field_2 + 8));
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseExtend(RepeatedPtrField<FieldDescriptorProto>* extensions,
                         RepeatedPtrField<DescriptorProto>* messages,
                         const LocationRecorder& parent_location,
                         int location_field_number_for_nested_type,
                         const LocationRecorder& extend_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("extend"));

  // Parse the extendee type.
  io::Tokenizer::Token extendee_start = input_->current();
  string extendee;
  DO(ParseUserDefinedType(&extendee));
  io::Tokenizer::Token extendee_end = input_->previous();

  // Parse the block.
  DO(ConsumeEndOfDeclaration("{", &extend_location));

  bool is_first = true;

  do {
    if (AtEnd()) {
      AddError("Reached end of input in extend definition (missing '}').");
      return false;
    }

    // Note that kExtensionFieldNumber was already pushed by the parent.
    LocationRecorder location(extend_location, extensions->size());

    FieldDescriptorProto* field = extensions->Add();

    {
      LocationRecorder extendee_location(
          location, FieldDescriptorProto::kExtendeeFieldNumber);
      extendee_location.StartAt(extendee_start);
      extendee_location.EndAt(extendee_end);

      if (is_first) {
        extendee_location.RecordLegacyLocation(
            field, DescriptorPool::ErrorCollector::EXTENDEE);
        is_first = false;
      }
    }

    field->set_extendee(extendee);

    if (!ParseMessageField(field, messages, parent_location,
                           location_field_number_for_nested_type,
                           location,
                           containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", NULL));

  return true;
}